

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Value * __thiscall
soul::heart::Parser::parseAnnotationValue(Value *__return_storage_ptr__,Parser *this)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  StringDictionary *pSVar4;
  CompileMessage local_180;
  undefined1 local_141;
  CompileMessage local_140;
  char *local_108;
  Value local_f0;
  char *local_b0;
  uint32_t local_a4;
  char *local_a0;
  undefined1 local_98 [16];
  Handle local_84;
  char *pcStack_80;
  Handle v_4;
  double v_3;
  double v_2;
  int64_t v_1;
  int64_t v;
  Parser *this_local;
  Value *infOrNaN;
  
  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)"$integer32");
  if (bVar3) {
    lVar2 = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    soul::Value::createInt32<long>(__return_storage_ptr__,lVar2);
  }
  else {
    bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)"$integer64");
    if (bVar3) {
      lVar2 = (this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).literalIntValue;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      soul::Value::createInt64<long>(__return_storage_ptr__,lVar2);
    }
    else {
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)"$float32");
      if (bVar3) {
        dVar1 = (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).literalDoubleValue;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        soul::Value::Value(__return_storage_ptr__,(float)dVar1);
      }
      else {
        bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,(TokenType)"$float64");
        if (bVar3) {
          dVar1 = (this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).literalDoubleValue;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
          soul::Value::Value(__return_storage_ptr__,dVar1);
        }
        else {
          pcStack_80 = "$string literal";
          bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matches(&this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ,(TokenType)"$string literal");
          if (bVar3) {
            pSVar4 = Program::getStringDictionary(&this->program);
            local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)
                                  &(this->
                                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                   ).currentStringValue);
            local_84.handle =
                 (*(pSVar4->super_StringDictionary)._vptr_StringDictionary[2])
                           (pSVar4,local_98._0_8_,local_98._8_8_);
            local_a0 = (char *)Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ::skip(&this->
                                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                     );
            local_a4 = local_84.handle;
            soul::Value::createStringLiteral(__return_storage_ptr__,local_84);
          }
          else {
            bVar3 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                    ::matchIf<char_const*>
                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                *)this,"true");
            if (bVar3) {
              soul::Value::Value(__return_storage_ptr__,true);
            }
            else {
              bVar3 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      ::matchIf<char_const*>
                                ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                  *)this,"false");
              if (bVar3) {
                soul::Value::Value(__return_storage_ptr__,false);
              }
              else {
                local_b0 = "-";
                bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ::matchIf<soul::TokenType>
                                  (&this->
                                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                   ,(TokenType)0x4cfab9);
                if (bVar3) {
                  parseAnnotationValue(&local_f0,this);
                  negate(__return_storage_ptr__,this,&local_f0);
                  soul::Value::~Value(&local_f0);
                }
                else {
                  local_108 = "$variableIdentifier";
                  bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ::matches(&this->
                                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    ,(TokenType)"$variableIdentifier");
                  if (bVar3) {
                    Errors::propertyMustBeConstant<>();
                    CodeLocation::throwError
                              (&(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).location,&local_140);
                  }
                  local_141 = 0;
                  parseNaNandInfinityTokens(__return_storage_ptr__,this);
                  bVar3 = soul::Value::isValid(__return_storage_ptr__);
                  if (!bVar3) {
                    Errors::missingAnnotationValue<>();
                    CodeLocation::throwError
                              (&(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).location,&local_180);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value parseAnnotationValue()
    {
        if (matches (Token::literalInt32))       { auto v = literalIntValue;    skip(); return Value::createInt32 (v); }
        if (matches (Token::literalInt64))       { auto v = literalIntValue;    skip(); return Value::createInt64 (v); }
        if (matches (Token::literalFloat32))     { auto v = literalDoubleValue; skip(); return Value ((float) v); }
        if (matches (Token::literalFloat64))     { auto v = literalDoubleValue; skip(); return Value (v); }
        if (matches (Token::literalString))      { auto v = program.getStringDictionary().getHandleForString (currentStringValue); skip(); return Value::createStringLiteral(v); }
        if (matchIf ("true"))                    { return Value (true); }
        if (matchIf ("false"))                   { return Value (false); }
        if (matchIf (HEARTOperator::minus))      { return negate (parseAnnotationValue()); }
        if (matches (Token::variableIdentifier)) { location.throwError (Errors::propertyMustBeConstant()); }

        auto infOrNaN = parseNaNandInfinityTokens();

        if (infOrNaN.isValid())
            return infOrNaN;

        location.throwError (Errors::missingAnnotationValue());
    }